

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_edges(void)

{
  size_t cases;
  size_t i;
  secp256k1_gej res;
  secp256k1_ge point;
  secp256k1_scalar q;
  secp256k1_scalar *in_stack_00000d50;
  secp256k1_ge *in_stack_00000d58;
  secp256k1_gej *in_stack_00000d60;
  secp256k1_scalar *a;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_scalar *in_stack_fffffffffffffef0;
  secp256k1_scalar *in_stack_fffffffffffffef8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  
  for (a = (secp256k1_scalar *)0x0; a < (secp256k1_scalar *)0x15;
      a = (secp256k1_scalar *)((long)a->d + 1)) {
    secp256k1_scalar_negate(in_stack_fffffffffffffee0,a);
    if (a != (secp256k1_scalar *)0x0) {
      secp256k1_scalar_add
                ((secp256k1_scalar *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0);
      secp256k1_scalar_add
                ((secp256k1_scalar *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0);
    }
    testutil_random_ge_test(in_stack_ffffffffffffff00);
    secp256k1_ecmult_const(in_stack_00000d60,in_stack_00000d58,in_stack_00000d50);
    ecmult_const_check_result
              ((secp256k1_ge *)res.y._40_8_,(secp256k1_scalar *)res.y.n[4],
               (secp256k1_gej *)res.y.n[3]);
  }
  return;
}

Assistant:

static void ecmult_const_edges(void) {
    secp256k1_scalar q;
    secp256k1_ge point;
    secp256k1_gej res;
    size_t i;
    size_t cases = 1 + sizeof(scalars_near_split_bounds) / sizeof(scalars_near_split_bounds[0]);

    /* We are trying to reach the following edge cases (variables are defined as
     * in ecmult_const_impl.h):
     *   1. i = 0: s = 0 <=> q = -K
     *   2. i > 0: v1, v2 large values
     *               <=> s1, s2 large values
     *               <=> s = scalars_near_split_bounds[i]
     *               <=> q = 2*scalars_near_split_bounds[i] - K
     */
    for (i = 0; i < cases; ++i) {
        secp256k1_scalar_negate(&q, &secp256k1_ecmult_const_K);
        if (i > 0) {
            secp256k1_scalar_add(&q, &q, &scalars_near_split_bounds[i - 1]);
            secp256k1_scalar_add(&q, &q, &scalars_near_split_bounds[i - 1]);
        }
        testutil_random_ge_test(&point);
        secp256k1_ecmult_const(&res, &point, &q);
        ecmult_const_check_result(&point, &q, &res);
    }
}